

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

Data * __thiscall
density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
consume_operation::
element<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
          (consume_operation *this)

{
  bool bVar1;
  runtime_type<> *this_00;
  Data *pDVar2;
  consume_operation *this_local;
  
  bVar1 = heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          consume_operation::empty((consume_operation *)this);
  if (!bVar1) {
    this_00 = heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              consume_operation::complete_type((consume_operation *)this);
    bVar1 = runtime_type<>::
            is<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
                      (this_00);
    if (bVar1) goto LAB_025041b0;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",anon_var_dwarf_12e55
             ,0x415);
LAB_025041b0:
  pDVar2 = (Data *)heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::get_element(*(QueueControl **)(this + 8));
  return pDVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(get_element(m_control));
            }